

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

int32_t __thiscall
icu_63::CollationBuilder::insertTailoredNodeAfter
          (CollationBuilder *this,int32_t index,int32_t strength,UErrorCode *errorCode)

{
  int iVar1;
  int32_t iVar2;
  uint nextIndex;
  uint uVar3;
  uint uVar4;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((0 < strength) && (index = findCommonNode(this,index,1), strength != 1)) {
      index = findCommonNode(this,index,2);
    }
    iVar1 = (this->nodes).count;
    nextIndex = 0;
    if (index < iVar1 && -1 < index) {
      nextIndex = *(uint *)((this->nodes).elements + (uint)index) >> 8 & 0xfffff;
    }
    if (nextIndex != 0) {
      uVar3 = nextIndex;
      do {
        uVar4 = 0;
        if ((int)uVar3 < iVar1) {
          uVar4 = *(uint *)((this->nodes).elements + uVar3);
        }
        nextIndex = uVar3;
      } while ((strength < (int)(uVar4 & 3)) &&
              (nextIndex = uVar4 >> 8 & 0xfffff, index = uVar3, uVar3 = nextIndex, nextIndex != 0));
    }
    iVar2 = insertNodeBetween(this,index,nextIndex,(long)(int)(strength | 8),errorCode);
    return iVar2;
  }
  return 0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }